

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toctree.c
# Opt level: O3

char * blogc_toctree_render(bc_slist_t *headers,int maxdepth,char *endl)

{
  void **ppvVar1;
  ulong *puVar2;
  _bc_slist_t *p_Var3;
  bc_string_t *str;
  ulong uVar4;
  char *pcVar5;
  char *suffix;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  
  if (maxdepth != 0 && headers != (bc_slist_t *)0x0) {
    p_Var3 = headers;
    uVar8 = 0;
    do {
      ppvVar1 = &p_Var3->data;
      p_Var3 = p_Var3->next;
      uVar6 = **ppvVar1;
      if (uVar8 - 1 < **ppvVar1) {
        uVar6 = uVar8;
      }
      uVar8 = uVar6;
    } while (p_Var3 != (_bc_slist_t *)0x0);
    if (uVar6 != 0) {
      str = bc_string_new();
      pcVar5 = "\n";
      if (endl != (char *)0x0) {
        pcVar5 = endl;
      }
      bc_string_append_printf(str,"<ul>%s",pcVar5);
      lVar7 = 4;
      do {
        puVar2 = (ulong *)headers->data;
        uVar4 = *puVar2;
        if (uVar4 - uVar6 < (ulong)(long)maxdepth) {
          while (uVar4 < uVar8) {
            lVar7 = lVar7 + -4;
            bc_string_append_printf(str,"%*s</ul>%s",lVar7,"",pcVar5);
            uVar8 = uVar8 - 1;
            uVar4 = *puVar2;
          }
          if (uVar8 < uVar4) {
            do {
              bc_string_append_printf(str,"%*s<ul>%s",lVar7,"",pcVar5);
              uVar8 = uVar8 + 1;
              lVar7 = lVar7 + 4;
            } while (uVar8 < *puVar2);
          }
          bc_string_append_printf(str,"%*s<li>",lVar7,"");
          suffix = (char *)puVar2[2];
          if (puVar2[1] == 0) {
            bc_string_append(str,suffix);
          }
          else {
            if (suffix == (char *)0x0) {
              suffix = "";
            }
            bc_string_append_printf(str,"<a href=\"#%s\">%s</a>",puVar2[1],suffix);
          }
          bc_string_append_printf(str,"</li>%s",pcVar5);
        }
        headers = headers->next;
      } while (headers != (_bc_slist_t *)0x0);
      for (; uVar6 <= uVar8; uVar8 = uVar8 - 1) {
        lVar7 = lVar7 + -4;
        bc_string_append_printf(str,"%*s</ul>%s",lVar7,"",pcVar5);
      }
      pcVar5 = bc_string_free(str,false);
      return pcVar5;
    }
  }
  return (char *)0x0;
}

Assistant:

char*
blogc_toctree_render(bc_slist_t *headers, int maxdepth, const char *endl)
{
    if (headers == NULL || maxdepth == 0)
        return NULL;

    // find lower level
    size_t lower_level = 0;
    for (bc_slist_t *l = headers; l != NULL; l = l->next) {
        size_t lv = ((blogc_toctree_header_t*) l->data)->level;
        if (lower_level == 0 || lower_level > lv) {
            lower_level = lv;
        }
    }

    if (lower_level == 0)
        return NULL;

    // render
    bc_string_t *rv = bc_string_new();
    bc_string_append_printf(rv, "<ul>%s", endl == NULL ? "\n" : endl);
    size_t spacing = 4;
    size_t current_level = lower_level;
    for (bc_slist_t *l = headers; l != NULL; l = l->next) {
        blogc_toctree_header_t *t = l->data;
        if (t->level - lower_level >= maxdepth) {
            continue;
        }
        while (current_level > t->level) {
            spacing -= 4;
            bc_string_append_printf(rv, "%*s</ul>%s", spacing, "",
                endl == NULL ? "\n" : endl);
            current_level--;
        }
        while (current_level < t->level) {
            bc_string_append_printf(rv, "%*s<ul>%s", spacing, "",
                endl == NULL ? "\n" : endl);
            current_level++;
            spacing += 4;
        }
        bc_string_append_printf(rv, "%*s<li>", spacing, "");
        if (t->slug != NULL) {
            bc_string_append_printf(rv, "<a href=\"#%s\">%s</a>", t->slug,
                t->text != NULL ? t->text : "");
        }
        else {
            bc_string_append(rv, t->text);
        }
        bc_string_append_printf(rv, "</li>%s", endl == NULL ? "\n" : endl);
    }

    // close leftovers
    while (current_level >= lower_level) {
        spacing -= 4;
        bc_string_append_printf(rv, "%*s</ul>%s", spacing, "",
            endl == NULL ? "\n" : endl);
        current_level--;
    }

    return bc_string_free(rv, false);
}